

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test::
TestBody(ZLIBBufferCompressorTest_compressor_and_decompressor_can_be_reused_Test *this)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  char *pcVar5;
  ByteBuffer compressed2;
  AssertionResult gtest_ar_1;
  ByteBuffer decompressed2;
  ByteBuffer decompressed1;
  ByteBuffer compressed1;
  ZLIBBufferInflator decompressor1;
  ZLIBBufferCompressor compressor1;
  AssertHelper AStack_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  internal local_1e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  internal local_1d0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8 [5];
  ByteBuffer local_1a0 [48];
  ByteBuffer local_170 [48];
  ZLIBBufferInflator local_140 [120];
  ZLIBBufferCompressor local_c8 [168];
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_c8,5);
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress
            ((uchar *)local_c8,
             (ulong)(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT._M_dataplus._M_p,
             0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate(local_1a0);
  pvVar2 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
  lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,pvVar2,lVar3 + (long)pvVar2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_1d0,"FRACTION_OF_BIGGER_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",
             &(this->super_ZLIBBufferCompressorTest).FRACTION_OF_BIGGER_TEXT,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_210);
    if (local_1c8[0].ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_1c8[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_230,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x113,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_230,(Message *)&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_210._M_dataplus._M_p + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(local_1c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress
              ((uchar *)local_c8,
               (ulong)(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)local_1d0);
    pvVar4 = (void *)bidfx_public_api::tools::ByteBuffer::ToArray();
    lVar3 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,pvVar4,lVar3 + (long)pvVar4);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_1e0,"BIGGER_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",
               &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if (local_1e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_230);
      if (local_1d8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_1d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_238,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x11a,pcVar5);
      testing::internal::AssertHelper::operator=(&AStack_238,(Message *)&local_230);
      testing::internal::AssertHelper::~AssertHelper(&AStack_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0)) {
          (**(code **)(*(size_type *)local_230._M_dataplus._M_p + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_1d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,1);
    }
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_1d0);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&local_210);
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,1);
  }
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_1a0);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_140);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_170);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_c8);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, compressor_and_decompressor_can_be_reused)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &FRACTION_OF_BIGGER_TEXT[0], 0, FRACTION_OF_BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(FRACTION_OF_BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}